

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address-conversion.cc
# Opt level: O2

uint32_t num2len(uint32_t i)

{
  uint32_t len;
  
  len = 0;
  for (; i != 0; i = i * 2) {
    len = len + 1;
  }
  return len;
}

Assistant:

uint32_t num2len(uint32_t i)
{
    uint32_t len = 0;
    while (i != 0)
    {
        i = i << 1;
        ++len;
    }
    return len;
}